

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

TimeArrayTimeZoneRule * __thiscall
icu_63::TimeArrayTimeZoneRule::operator=(TimeArrayTimeZoneRule *this,TimeArrayTimeZoneRule *right)

{
  UErrorCode local_1c;
  TimeArrayTimeZoneRule *pTStack_18;
  UErrorCode status;
  TimeArrayTimeZoneRule *right_local;
  TimeArrayTimeZoneRule *this_local;
  
  if (this != right) {
    pTStack_18 = right;
    right_local = this;
    TimeZoneRule::operator=(&this->super_TimeZoneRule,&right->super_TimeZoneRule);
    local_1c = U_ZERO_ERROR;
    initStartTimes(this,pTStack_18->fStartTimes,pTStack_18->fNumStartTimes,&local_1c);
    this->fTimeRuleType = pTStack_18->fTimeRuleType;
  }
  return this;
}

Assistant:

TimeArrayTimeZoneRule&
TimeArrayTimeZoneRule::operator=(const TimeArrayTimeZoneRule& right) {
    if (this != &right) {
        TimeZoneRule::operator=(right);
        UErrorCode status = U_ZERO_ERROR;
        initStartTimes(right.fStartTimes, right.fNumStartTimes, status);
        //TODO - status?
        fTimeRuleType = right.fTimeRuleType;        
    }
    return *this;
}